

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::Resize(TPZVec<TPZEqnArray<long_double>_> *this,int64_t newsize)

{
  TPZEqnArray<long_double> *pTVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  TPZEqnArray<long_double> *pTVar7;
  long lVar8;
  bool bVar9;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar1 = this->fStore;
      if (pTVar1 != (TPZEqnArray<long_double> *)0x0) {
        lVar6 = *(long *)&pTVar1[-1].field_0x51d8;
        if (lVar6 != 0) {
          lVar8 = lVar6 * 0x51e0;
          do {
            TPZEqnArray<long_double>::~TPZEqnArray
                      ((TPZEqnArray<long_double> *)
                       ((long)pTVar1[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                       lVar8 + -0x28));
            lVar8 = lVar8 + -0x51e0;
          } while (lVar8 != 0);
        }
        operator_delete__(&pTVar1[-1].fLastTerm,lVar6 * 0x51e0 | 0x10);
      }
      this->fStore = (TPZEqnArray<long_double> *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = newsize;
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x51e0),8) == 0) {
        uVar5 = SUB168(auVar2 * ZEXT816(0x51e0),0) | 0x10;
      }
      pvVar4 = operator_new__(uVar5);
      *(int64_t *)((long)pvVar4 + 8) = newsize;
      pTVar1 = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
      lVar6 = 0;
      pTVar7 = pTVar1;
      do {
        TPZEqnArray<long_double>::TPZEqnArray(pTVar7);
        lVar6 = lVar6 + -0x51e0;
        pTVar7 = pTVar7 + 1;
      } while (newsize * -0x51e0 - lVar6 != 0);
      lVar6 = this->fNElements;
      if (newsize <= this->fNElements) {
        lVar6 = newsize;
      }
      lVar8 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar8;
      }
      while( true ) {
        pTVar7 = this->fStore;
        bVar9 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        if (bVar9) break;
        TPZEqnArray<long_double>::operator=
                  ((TPZEqnArray<long_double> *)
                   ((long)(pTVar1->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28)
                   ,(TPZEqnArray<long_double> *)
                    ((long)(pTVar7->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28
                    ));
        lVar8 = lVar8 + 0x51e0;
      }
      if (pTVar7 != (TPZEqnArray<long_double> *)0x0) {
        lVar6 = *(long *)&pTVar7[-1].field_0x51d8;
        if (lVar6 != 0) {
          lVar8 = lVar6 * 0x51e0;
          do {
            TPZEqnArray<long_double>::~TPZEqnArray
                      ((TPZEqnArray<long_double> *)
                       ((long)pTVar7[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                       lVar8 + -0x28));
            lVar8 = lVar8 + -0x51e0;
          } while (lVar8 != 0);
        }
        operator_delete__(&pTVar7[-1].fLastTerm,lVar6 * 0x51e0 | 0x10);
      }
      this->fStore = pTVar1;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}